

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

char * __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::EnumToString
          (ShaderImageLoadStoreBase *this,GLenum e)

{
  int iVar1;
  
  iVar1 = (int)this;
  if (iVar1 < 0x8513) {
    if (iVar1 < 0x806f) {
      if (iVar1 == 0xde0) {
        return "GL_TEXTURE_1D";
      }
      if (iVar1 == 0xde1) {
        return "GL_TEXTURE_2D";
      }
    }
    else {
      if (iVar1 == 0x806f) {
        return "GL_TEXTURE_3D";
      }
      if (iVar1 == 0x84f5) {
        return "GL_TEXTURE_RECTANGLE";
      }
    }
  }
  else if (iVar1 < 0x8c1a) {
    if (iVar1 == 0x8513) {
      return "GL_TEXTURE_CUBE_MAP";
    }
    if (iVar1 == 0x8c18) {
      return "GL_TEXTURE_1D_ARRAY";
    }
  }
  else {
    if (iVar1 == 0x8c1a) {
      return "GL_TEXTURE_2D_ARRAY";
    }
    if (iVar1 == 0x9009) {
      return "GL_TEXTURE_CUBE_MAP_ARRAY";
    }
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                ,0x326,
                "const char *gl4cts::(anonymous namespace)::ShaderImageLoadStoreBase::EnumToString(GLenum)"
               );
}

Assistant:

const char* EnumToString(GLenum e)
	{
		switch (e)
		{
		case GL_TEXTURE_1D:
			return "GL_TEXTURE_1D";
		case GL_TEXTURE_2D:
			return "GL_TEXTURE_2D";
		case GL_TEXTURE_3D:
			return "GL_TEXTURE_3D";
		case GL_TEXTURE_RECTANGLE:
			return "GL_TEXTURE_RECTANGLE";
		case GL_TEXTURE_CUBE_MAP:
			return "GL_TEXTURE_CUBE_MAP";
		case GL_TEXTURE_1D_ARRAY:
			return "GL_TEXTURE_1D_ARRAY";
		case GL_TEXTURE_2D_ARRAY:
			return "GL_TEXTURE_2D_ARRAY";
		case GL_TEXTURE_CUBE_MAP_ARRAY:
			return "GL_TEXTURE_CUBE_MAP_ARRAY";

		default:
			assert(0);
			break;
		}
		return NULL;
	}